

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

void __thiscall
AlignmentRecord::mergeAlignmentRecordsSingle(AlignmentRecord *this,AlignmentRecord *ar,int i,int j)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  ShortDnaSequence *pSVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  uint *puVar10;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  long lVar11;
  uint *puVar12;
  AlignmentRecord *pAVar13;
  size_type sVar14;
  AlignmentRecord *pAVar15;
  int *piVar16;
  int ref_s_pos2;
  AlignmentRecord *local_168;
  int ref_s_pos1;
  AlignmentRecord *local_158;
  int ref_rel_pos1;
  undefined8 local_148;
  int q_pos2;
  undefined8 local_138;
  int local_130;
  int local_12c;
  int local_128;
  int c_pos2;
  int c_pos1;
  int q_pos1;
  string qualities;
  string nucigar;
  string ref;
  string dna;
  vector<char,_std::allocator<char>_> cigar;
  string algn;
  
  local_138 = CONCAT44(in_register_00000014,i);
  local_148 = CONCAT44(in_register_0000000c,j);
  local_168 = ar;
  local_158 = this;
  std::__cxx11::string::string((string *)&dna,"",(allocator *)&cigar);
  std::__cxx11::string::string((string *)&ref,"",(allocator *)&cigar);
  std::__cxx11::string::string((string *)&algn,"",(allocator *)&cigar);
  std::__cxx11::string::string((string *)&qualities,"",(allocator *)&cigar);
  std::__cxx11::string::string((string *)&nucigar,"",(allocator *)&cigar);
  pAVar13 = local_158;
  if ((int)local_138 == 1) {
    pvVar1 = &local_158->cigar1_unrolled;
    iVar4 = computeOffset(pvVar1);
    iVar5 = computeRevOffset(pvVar1);
    iVar5 = iVar5 + pAVar13->end1;
    iVar4 = pAVar13->start1 - iVar4;
    ref_s_pos1 = iVar4;
    if ((int)local_148 == 1) {
      std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_168->cigar1_unrolled);
      iVar6 = computeOffset(&cigar);
      iVar7 = computeRevOffset(&cigar);
      goto LAB_0018676b;
    }
    std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_168->cigar2_unrolled);
    iVar6 = computeOffset(&cigar);
    iVar7 = computeRevOffset(&cigar);
LAB_001867ed:
    iVar6 = local_168->start2 - iVar6;
    iVar7 = iVar7 + local_168->end2;
  }
  else {
    pvVar1 = &local_158->cigar2_unrolled;
    iVar4 = computeOffset(pvVar1);
    iVar5 = computeRevOffset(pvVar1);
    iVar4 = pAVar13->start2 - iVar4;
    iVar5 = iVar5 + pAVar13->end2;
    ref_s_pos1 = iVar4;
    if ((int)local_148 != 1) {
      std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_168->cigar2_unrolled);
      iVar6 = computeOffset(&cigar);
      iVar7 = computeRevOffset(&cigar);
      goto LAB_001867ed;
    }
    std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_168->cigar1_unrolled);
    iVar6 = computeOffset(&cigar);
    iVar7 = computeRevOffset(&cigar);
LAB_0018676b:
    iVar6 = local_168->start1 - iVar6;
    iVar7 = iVar7 + local_168->end1;
  }
  ref_s_pos2 = iVar6;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&cigar.super__Vector_base<char,_std::allocator<char>_>);
  q_pos1 = 0;
  q_pos2 = 0;
  c_pos1 = 0;
  c_pos2 = 0;
  ref_rel_pos1 = 0;
  local_128 = 0;
  if ((iVar6 < iVar4) || (iVar7 < iVar5)) {
    if ((iVar6 < iVar4) || (iVar5 < iVar7)) {
      if ((iVar6 <= iVar4) && (iVar5 <= iVar7)) {
        local_12c = iVar7;
        local_130 = iVar5;
        while (ref_s_pos2 < iVar4) {
          noOverlapMerge(local_168,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos2,
                         &local_128,(int)local_148);
        }
        while (ref_s_pos2 <= local_130) {
          overlapMerge(local_158,&algn,&ref,local_168,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,
                       &q_pos1,&q_pos2,&ref_s_pos2,&ref_rel_pos1,(int)local_138,(int)local_148);
        }
        local_128 = ref_rel_pos1 + local_128 + -1;
        while (ref_s_pos2 <= local_12c) {
          noOverlapMerge(local_168,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos2,
                         &local_128,(int)local_148);
        }
        goto LAB_00186d43;
      }
      while (ref_s_pos2 < iVar4) {
        noOverlapMerge(local_168,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos2,
                       &local_128,(int)local_148);
      }
      while (ref_s_pos2 <= iVar7) {
        overlapMerge(local_158,&algn,&ref,local_168,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1
                     ,&q_pos2,&ref_s_pos2,&ref_rel_pos1,(int)local_138,(int)local_148);
      }
      while (ref_s_pos2 <= iVar5) {
        noOverlapMerge(local_158,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos2,
                       &ref_rel_pos1,(int)local_138);
      }
    }
    else {
      local_12c = iVar7;
      local_130 = iVar5;
      while (ref_s_pos1 < iVar6) {
        noOverlapMerge(local_158,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                       &ref_rel_pos1,(int)local_138);
      }
      while (ref_s_pos1 <= local_12c) {
        overlapMerge(local_158,&algn,&ref,local_168,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1
                     ,&q_pos2,&ref_s_pos1,&ref_rel_pos1,(int)local_138,(int)local_148);
      }
      while (ref_s_pos1 <= local_130) {
        noOverlapMerge(local_158,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                       &ref_rel_pos1,(int)local_138);
      }
    }
    piVar16 = &ref_rel_pos1;
    iVar4 = (int)local_138;
    pAVar13 = local_158;
  }
  else {
    local_12c = iVar7;
    while (ref_s_pos1 < iVar6) {
      noOverlapMerge(local_158,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                     &ref_rel_pos1,(int)local_138);
    }
    local_130 = ref_rel_pos1;
    while (ref_s_pos1 <= iVar5) {
      overlapMerge(local_158,&algn,&ref,local_168,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1,
                   &q_pos2,&ref_s_pos1,&ref_rel_pos1,(int)local_138,(int)local_148);
    }
    local_128 = ref_rel_pos1 - local_130;
    while (ref_s_pos1 <= local_12c) {
      noOverlapMerge(local_168,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos1,
                     &local_128,(int)local_148);
    }
LAB_00186d43:
    piVar16 = &local_128;
    iVar4 = (int)local_148;
    pAVar13 = local_168;
  }
  updateReference(pAVar13,&ref,iVar4,*piVar16);
  pAVar13 = local_158;
  if ((int)local_138 == 1) {
    uVar8 = local_158->start1;
    if ((int)local_148 == 1) {
      if (local_168->start1 < uVar8) {
        uVar8 = local_168->start1;
      }
      local_158->start1 = uVar8;
      uVar8 = local_158->end1;
      if (local_158->end1 < local_168->end1) {
        uVar8 = local_168->end1;
      }
      local_158->end1 = uVar8;
      local_158->single_end = true;
      createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar,&nucigar);
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::_M_move_assign
                (&pAVar13->cigar1,
                 (_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar);
      std::_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~_Vector_base
                ((_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar);
      ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&cigar,&dna,&qualities);
      pSVar2 = &pAVar13->sequence1;
      ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&cigar);
      ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&cigar);
      iVar4 = phred_sum(&qualities,'!');
      pAVar13->phred_sum1 = iVar4;
      sVar9 = ShortDnaSequence::size(pSVar2);
      pAVar13->length_incl_deletions1 = (int)sVar9;
      sVar9 = ShortDnaSequence::size(pSVar2);
      pAVar13->length_incl_longdeletions1 = (int)sVar9;
      pcVar3 = (pAVar13->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pAVar13->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar3) {
        (pAVar13->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar3;
      }
      for (sVar14 = 0; pAVar15 = local_158, nucigar._M_string_length != sVar14; sVar14 = sVar14 + 1)
      {
        cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = nucigar._M_dataplus._M_p[sVar14];
        std::vector<char,_std::allocator<char>_>::push_back
                  (&pAVar13->cigar1_unrolled,(value_type *)&cigar);
      }
      std::__cxx11::string::_M_assign((string *)&local_158->reference_seq1);
      lVar11 = 0x2e0;
      std::__cxx11::string::_M_assign((string *)&pAVar15->alignSequence1);
      goto LAB_0018717b;
    }
    if (local_168->start2 < uVar8) {
      uVar8 = local_168->start2;
    }
    local_158->start2 = uVar8;
    uVar8 = local_168->end2;
    if (local_168->end2 < local_158->end1) {
      uVar8 = local_158->end1;
    }
    local_158->end2 = uVar8;
    createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar,&nucigar);
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::_M_move_assign
              (&pAVar13->cigar2,
               (_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar);
    std::_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~_Vector_base
              ((_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar);
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&cigar,&dna,&qualities);
    pSVar2 = &pAVar13->sequence2;
    ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&cigar);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&cigar);
    iVar4 = phred_sum(&qualities,'!');
    pAVar13->phred_sum2 = iVar4;
    sVar9 = ShortDnaSequence::size(pSVar2);
    pAVar13->length_incl_deletions2 = (int)sVar9;
    sVar9 = ShortDnaSequence::size(pSVar2);
    pAVar13->length_incl_longdeletions2 = (int)sVar9;
    pcVar3 = (pAVar13->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pAVar13->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar3) {
      (pAVar13->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3;
    }
    for (sVar14 = 0; nucigar._M_string_length != sVar14; sVar14 = sVar14 + 1) {
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
      ._0_1_ = nucigar._M_dataplus._M_p[sVar14];
      std::vector<char,_std::allocator<char>_>::push_back
                (&pAVar13->cigar2_unrolled,(value_type *)&cigar);
    }
  }
  else {
    local_158->single_end = false;
    createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar,&nucigar);
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::_M_move_assign
              (&pAVar13->cigar2,
               (_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar);
    std::_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~_Vector_base
              ((_Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar);
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&cigar,&dna,&qualities);
    pSVar2 = &pAVar13->sequence2;
    ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&cigar);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&cigar);
    iVar4 = phred_sum(&qualities,'!');
    pAVar13->phred_sum2 = iVar4;
    sVar9 = ShortDnaSequence::size(pSVar2);
    pAVar13->length_incl_deletions2 = (int)sVar9;
    sVar9 = ShortDnaSequence::size(pSVar2);
    pAVar13->length_incl_longdeletions2 = (int)sVar9;
    pcVar3 = (pAVar13->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pAVar13->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar3) {
      (pAVar13->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3;
    }
    for (sVar14 = 0; nucigar._M_string_length != sVar14; sVar14 = sVar14 + 1) {
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
      ._0_1_ = nucigar._M_dataplus._M_p[sVar14];
      std::vector<char,_std::allocator<char>_>::push_back
                (&pAVar13->cigar2_unrolled,(value_type *)&cigar);
    }
    puVar10 = &local_168->start2;
    if ((int)local_148 == 1) {
      puVar10 = &local_168->start1;
    }
    puVar12 = &local_168->end1;
    if ((int)local_148 != 1) {
      puVar12 = &local_168->end2;
    }
    uVar8 = local_158->start2;
    if (*puVar10 < local_158->start2) {
      uVar8 = *puVar10;
    }
    local_158->start2 = uVar8;
    uVar8 = local_158->end2;
    if (local_158->end2 < *puVar12) {
      uVar8 = *puVar12;
    }
    local_158->end2 = uVar8;
  }
  pAVar15 = local_158;
  std::__cxx11::string::_M_assign((string *)&local_158->reference_seq2);
  lVar11 = 0x2f8;
  std::__cxx11::string::_M_assign((string *)&pAVar15->alignSequence2);
LAB_0018717b:
  std::vector<int,std::allocator<int>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<int,std::allocator<int>> *)((long)&(pAVar15->name)._M_dataplus._M_p + lVar11),
             qualities._M_dataplus._M_p,qualities._M_dataplus._M_p + qualities._M_string_length);
  std::__cxx11::string::~string((string *)&nucigar);
  std::__cxx11::string::~string((string *)&qualities);
  std::__cxx11::string::~string((string *)&algn);
  std::__cxx11::string::~string((string *)&ref);
  std::__cxx11::string::~string((string *)&dna);
  return;
}

Assistant:

void AlignmentRecord::mergeAlignmentRecordsSingle(const AlignmentRecord& ar, int i, int j){
    std::string dna = "";
    std::string ref = "";
    std::string algn = "";
    std::string qualities = "";
    std::string nucigar = "";
    int offset_f1, offset_f2, offset_b1, offset_b2, ref_s_pos1, ref_e_pos1, ref_s_pos2,ref_e_pos2 = 0;
    //i and j determine which cigar strings / sequences are considered

    if (i == 1){
         //get starting position and ending position according to ref position, paying attention to clipped bases
         //updated ref position including clips
         offset_f1 = computeOffset(this->cigar1_unrolled);
         offset_b1 = computeRevOffset(this->cigar1_unrolled);
         ref_e_pos1 = this->end1+offset_b1;
         ref_s_pos1 = this->start1-offset_f1;
         if(j == 1){
             std::vector<char> cigar = ar.getCigar1Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart1()-offset_f2;
             ref_e_pos2 = ar.getEnd1()+offset_b2;
         } else {
             std::vector<char> cigar = ar.getCigar2Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart2()-offset_f2;
             ref_e_pos2 = ar.getEnd2()+offset_b2;
         }
    } else {
         //get starting position and ending position according to ref position, paying attention to clipped bases
         //updated ref position including clips
         offset_f1 = computeOffset(this->cigar2_unrolled);
         offset_b1 = computeRevOffset(this->cigar2_unrolled);
         ref_s_pos1 = this->start2-offset_f1;
         ref_e_pos1 = this->end2+offset_b1;
         if(j == 1){
             std::vector<char> cigar = ar.getCigar1Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart1()-offset_f2;
             ref_e_pos2 = ar.getEnd1()+offset_b2;
         } else {
             std::vector<char> cigar = ar.getCigar2Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart2()-offset_f2;
             ref_e_pos2 = ar.getEnd2()+offset_b2;
         }
    }

    //position in query sequences // phred scores
    int q_pos1 = 0;
    int q_pos2 = 0;
    //position in unrolled cigar vectors
    int c_pos1 = 0;
    int c_pos2 = 0;
    //Position in the reference strings
    int ref_rel_pos1 =0;
    int ref_rel_pos2 =0;
    //4 cases of different overlaps
    //------------
    //     ------------
    if(ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
        while(ref_s_pos1<ref_s_pos2){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        ref_rel_pos2 = ref_rel_pos1;
        while(ref_s_pos1<=ref_e_pos1){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1,ref_rel_pos1,i,j);
        }
        ref_rel_pos2 = ref_rel_pos1-ref_rel_pos2;
        while(ref_s_pos1<=ref_e_pos2){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos1,ref_rel_pos2,j);
        }
        ar.updateReference(ref,j,ref_rel_pos2);

    }//------------------------------
        //           ----------
     else if (ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2){
        while(ref_s_pos1<ref_s_pos2){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        while(ref_s_pos1<=ref_e_pos2){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1,ref_rel_pos1,i,j);
        }
        while(ref_s_pos1<=ref_e_pos1){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        updateReference(ref,i,ref_rel_pos1);
        //           ----------
        //--------------------------
    } else if (ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
        while(ref_s_pos2<ref_s_pos1){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        while(ref_s_pos2<=ref_e_pos1){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2,ref_rel_pos1,i,j);
        }
        ref_rel_pos2 += ref_rel_pos1-1;
        while(ref_s_pos2<=ref_e_pos2){//Why is it less that equals here?Check with paper
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        ar.updateReference(ref,j,ref_rel_pos2);
        //           --------------------
        //---------------------
    } else {
        assert(ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2);
        while(ref_s_pos2<ref_s_pos1){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        while(ref_s_pos2<=ref_e_pos2){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar, c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2,ref_rel_pos1,i,j);
        }
        while(ref_s_pos2<=ref_e_pos1){
            noOverlapMerge(algn,ref,dna,qualities,nucigar, c_pos1,q_pos1,ref_s_pos2,ref_rel_pos1,i);
        }
        updateReference(ref,i,ref_rel_pos1);

    }
    if (i == 1){
        if(j == 1){
            this->start1 = std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd1(),this->end1);
            this->single_end= true;
            this->cigar1 = createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(),qualities.end());

        } else {
            this->start2 = std::min(this->start1,ar.getStart2());
            this->end2 = std::max(this->end1,ar.getEnd2());
            this->cigar2 = createCigar(nucigar);
            this->sequence2=ShortDnaSequence(dna,qualities);
            this->phred_sum2=phred_sum(qualities);
            this->length_incl_deletions2 = this->sequence2.size();
            this->length_incl_longdeletions2 = this->sequence2.size();
            this->cigar2_unrolled.clear();
            for (char i : nucigar){
                this->cigar2_unrolled.push_back(i);
            }
            this->reference_seq2 = ref;
            this->alignSequence2 = algn;
            this->qualityList2.assign(qualities.begin(),qualities.end());
        }
    } else {
        this->single_end= false;
        this->cigar2 = createCigar(nucigar);
        this->sequence2=ShortDnaSequence(dna,qualities);
        this->phred_sum2=phred_sum(qualities);
        this->length_incl_deletions2 = this->sequence2.size();
        this->length_incl_longdeletions2 = this->sequence2.size();
        this->cigar2_unrolled.clear();
        for (char i : nucigar){
            this->cigar2_unrolled.push_back(i);
        }
        if(j == 1){
            this->start2 = std::min(this->start2,ar.getStart1());
            this->end2=std::max(ar.getEnd1(),this->end2);

        }else {
            this->start2 = std::min(this->start2,ar.getStart2());
            this->end2=std::max(ar.getEnd2(),this->end2);
        }
        this->reference_seq2 = ref;
        this->alignSequence2 = algn;
        this->qualityList2.assign(qualities.begin(),qualities.end());
    }
}